

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

vector<CAddress,_std::allocator<CAddress>_> * __thiscall
AddrManImpl::GetAddr_
          (vector<CAddress,_std::allocator<CAddress>_> *__return_storage_ptr__,AddrManImpl *this,
          size_t max_addresses,size_t max_pct,optional<Network> network,bool filtered)

{
  string_view source_file;
  bool bVar1;
  uint uVar2;
  Network NVar3;
  ulong uVar4;
  time_point tVar5;
  uint64_t uVar6;
  const_iterator cVar7;
  Logger *pLVar8;
  ulong uVar9;
  AddrInfo *this_00;
  long lVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  vector<CAddress,_std::allocator<CAddress>_> *addresses;
  string log_msg;
  _Storage<Network,_true> local_108;
  unsigned_long local_e8 [14];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if (max_pct != 0) {
    uVar4 = (uVar4 * max_pct) / 100;
  }
  uVar9 = max_addresses;
  if (uVar4 < max_addresses) {
    uVar9 = uVar4;
  }
  if (max_addresses == 0) {
    uVar9 = uVar4;
  }
  tVar5 = NodeClock::now();
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar10 = (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar10 != 0) {
    uVar11 = lVar10 >> 2;
    uVar4 = 0;
    do {
      if (uVar9 <= (ulong)(((long)(__return_storage_ptr__->
                                  super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)(__return_storage_ptr__->
                                  super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                                  super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))
      break;
      uVar11 = uVar11 + ~uVar4;
      if (uVar11 == 0) {
        uVar2 = 0x40;
      }
      else {
        lVar10 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        uVar2 = (uint)lVar10 ^ 0x3f;
      }
      do {
        uVar6 = RandomMixin<FastRandomContext>::randbits
                          (&(this->insecure_rand).super_RandomMixin<FastRandomContext>,0x40 - uVar2)
        ;
      } while (uVar11 < uVar6);
      uVar2 = (uint)uVar4;
      SwapRandom(this,uVar2,(int)uVar6 + uVar2);
      cVar7 = std::
              _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->mapInfo)._M_h,
                     (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar4);
      if (cVar7.super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>._M_cur ==
          (__node_type *)0x0) {
        __assert_fail("it != mapInfo.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                      ,0x33c,
                      "std::vector<CAddress> AddrManImpl::GetAddr_(size_t, size_t, std::optional<Network>, const bool) const"
                     );
      }
      this_00 = (AddrInfo *)
                ((long)cVar7.super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>._M_cur
                + 0x10);
      if (((ulong)network.super__Optional_base<Network,_true,_true>._M_payload.
                  super__Optional_payload_base<Network> >> 0x20 & 1) == 0) {
LAB_0044a66f:
        bVar1 = AddrInfo::IsTerrible(this_00,(NodeSeconds)((long)tVar5.__d.__r / 1000000000));
        if (!filtered || !bVar1) {
          std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                    (__return_storage_ptr__,(value_type *)this_00);
        }
      }
      else {
        NVar3 = CNetAddr::GetNetClass((CNetAddr *)this_00);
        local_108._M_value =
             network.super__Optional_base<Network,_true,_true>._M_payload.
             super__Optional_payload_base<Network>._M_payload;
        if (NVar3 == local_108._M_value) goto LAB_0044a66f;
      }
      uVar4 = (ulong)(uVar2 + 1);
      uVar11 = (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
    } while (uVar4 < uVar11);
  }
  pLVar8 = LogInstance();
  bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar8,ADDRMAN,Debug);
  if (bVar1) {
    local_e8[0] = ((long)(__return_storage_ptr__->
                         super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(__return_storage_ptr__->
                         super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    pLVar8 = LogInstance();
    bVar1 = BCLog::Logger::Enabled(pLVar8);
    if (bVar1) {
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      tinyformat::format<unsigned_long>(&local_78,"GetAddr returned %d random addresses\n",local_e8)
      ;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pLVar8 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x54;
      local_78._M_string_length = 0x83f1d8;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp";
      source_file._M_len = 0x54;
      str._M_str = local_58._M_dataplus._M_p;
      str._M_len = local_58._M_string_length;
      logging_function._M_str = "GetAddr_";
      logging_function._M_len = 8;
      BCLog::Logger::LogPrintStr(pLVar8,str,logging_function,source_file,0x348,ADDRMAN,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CAddress> AddrManImpl::GetAddr_(size_t max_addresses, size_t max_pct, std::optional<Network> network, const bool filtered) const
{
    AssertLockHeld(cs);

    size_t nNodes = vRandom.size();
    if (max_pct != 0) {
        nNodes = max_pct * nNodes / 100;
    }
    if (max_addresses != 0) {
        nNodes = std::min(nNodes, max_addresses);
    }

    // gather a list of random nodes, skipping those of low quality
    const auto now{Now<NodeSeconds>()};
    std::vector<CAddress> addresses;
    for (unsigned int n = 0; n < vRandom.size(); n++) {
        if (addresses.size() >= nNodes)
            break;

        int nRndPos = insecure_rand.randrange(vRandom.size() - n) + n;
        SwapRandom(n, nRndPos);
        const auto it{mapInfo.find(vRandom[n])};
        assert(it != mapInfo.end());

        const AddrInfo& ai{it->second};

        // Filter by network (optional)
        if (network != std::nullopt && ai.GetNetClass() != network) continue;

        // Filter for quality
        if (ai.IsTerrible(now) && filtered) continue;

        addresses.push_back(ai);
    }
    LogDebug(BCLog::ADDRMAN, "GetAddr returned %d random addresses\n", addresses.size());
    return addresses;
}